

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

char32_t *
kj::_::CopyConstructArray_<char32_t,_char32_t_*,_true,_false>::apply
          (char32_t *pos,char32_t *start,char32_t *end)

{
  char32_t *params;
  char32_t *end_local;
  char32_t *start_local;
  char32_t *pos_local;
  
  end_local = start;
  start_local = pos;
  while (end_local != end) {
    params = mv<char32_t>(end_local);
    ctor<char32_t,char32_t>(start_local,params);
    end_local = end_local + 1;
    start_local = start_local + 1;
  }
  return start_local;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }